

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O2

void Abc_ConvertHopToGia_rec1(Gia_Man_t *p,Hop_Obj_t *pObj)

{
  uint __line;
  int iLit0;
  int iVar1;
  int *piVar2;
  char *__assertion;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Hop_IsComplement(pObj)";
    __line = 0x31;
LAB_0027de5a:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDress3.c"
                  ,__line,"void Abc_ConvertHopToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Abc_ConvertHopToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Abc_ConvertHopToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    iVar1 = -1;
    piVar2 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    iLit0 = iVar1;
    if (piVar2 != (int *)0x0) {
      iLit0 = Abc_LitNotCond(*piVar2,(uint)pObj->pFanin0 & 1);
    }
    piVar2 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (piVar2 != (int *)0x0) {
      iVar1 = Abc_LitNotCond(*piVar2,(uint)pObj->pFanin1 & 1);
    }
    iVar1 = Gia_ManHashAnd(p,iLit0,iVar1);
    (pObj->field_0).iData = iVar1;
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assertion = "!Hop_ObjIsMarkA(pObj)";
      __line = 0x37;
      goto LAB_0027de5a;
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Converts AIG from HOP to GIA.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_ConvertHopToGia_rec1( Gia_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertHopToGia_rec1( p, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertHopToGia_rec1( p, Hop_ObjFanin1(pObj) );
    pObj->iData = Gia_ManHashAnd( p, Hop_ObjChild0CopyI(pObj), Hop_ObjChild1CopyI(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}